

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImVector<ImFontConfig> *this;
  uint *puVar1;
  float *scanline;
  float fVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar10;
  stbtt__point sVar5;
  stbtt__point sVar6;
  undefined4 uVar9;
  stbtt_uint8 sVar11;
  uchar uVar12;
  uchar uVar13;
  byte bVar14;
  byte bVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  int iVar19;
  undefined4 uVar20;
  undefined1 uVar24;
  ImFontAtlas *pIVar21;
  ImFont *pIVar22;
  undefined6 uVar25;
  undefined4 uVar26;
  stbtt__active_edge *psVar23;
  short sVar27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [14];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined4 uVar37;
  undefined4 uVar38;
  undefined1 auVar39 [15];
  unkuint9 Var40;
  undefined1 auVar41 [15];
  undefined1 auVar42 [13];
  undefined1 auVar43 [14];
  undefined1 auVar44 [12];
  undefined1 auVar45 [15];
  unkbyte10 Var46;
  uint6 uVar47;
  stbrp_rect *psVar48;
  stbtt_uint32 sVar49;
  stbtt_uint32 sVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  stbtt__active_edge *z;
  stbtt_uint32 sVar50;
  stbtt_uint32 sVar51;
  stbtt_uint32 sVar52;
  stbtt_uint32 sVar53;
  ImFontBuildSrcData *pIVar61;
  ImFontConfig *pIVar62;
  ImFont **ppIVar63;
  undefined4 extraout_var;
  long lVar64;
  ImFontBuildDstData *pIVar65;
  stbrp_rect *psVar66;
  stbtt_packedchar *psVar67;
  int *piVar68;
  stbrp_context *ptr;
  uchar *puVar69;
  void *ptr_00;
  stbtt__point *points;
  stbtt__edge *p;
  stbtt__edge *psVar70;
  stbtt__buf *scanline_00;
  undefined8 *puVar71;
  long lVar72;
  stbtt_uint32 *psVar73;
  ushort uVar74;
  ushort uVar75;
  int iVar76;
  uint uVar77;
  ulong uVar78;
  stbtt__buf *psVar79;
  ImWchar *src_range;
  ImWchar *pIVar80;
  int iVar81;
  uint uVar82;
  ImU32 *it;
  ImVector<ImFont_*> *this_00;
  ushort *puVar83;
  uint *puVar84;
  int output_i;
  int iVar85;
  uint uVar86;
  int i;
  stbtt__active_edge *psVar87;
  stbtt__edge *psVar88;
  ulong uVar89;
  byte *pbVar90;
  ulong uVar91;
  long lVar92;
  int iVar93;
  int glyph_i;
  long lVar94;
  long lVar95;
  uchar *puVar96;
  stbrp_node *psVar97;
  ImU32 bit_n;
  uint uVar98;
  stbtt_uint8 *data;
  ImBitVector *this_01;
  stbtt__active_edge *psVar99;
  uchar *puVar100;
  int glyph_i_1;
  int x;
  float fVar101;
  int iVar102;
  ulong uVar103;
  stbtt__active_edge *psVar104;
  uchar *puVar105;
  bool bVar106;
  char cVar112;
  float sum;
  float fVar107;
  float fVar108;
  char cVar114;
  undefined4 extraout_XMM0_Db;
  short sVar115;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  short sVar113;
  undefined1 auVar111 [16];
  float fVar116;
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float in_XMM3_Da;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined4 uVar128;
  undefined1 auVar126 [16];
  undefined4 uVar129;
  undefined1 auVar127 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar133 [16];
  stbtt__buf sVar134;
  float y0_2;
  undefined1 local_4f8 [12];
  undefined4 uStack_4ec;
  int local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4cc;
  int y1;
  stbrp_node *local_4b8;
  float local_4ac;
  ImVector<ImFont_*> *local_4a8;
  stbtt_uint32 charstrings;
  undefined1 local_498 [28];
  uint local_47c;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  stbtt_uint32 fdarrayoff;
  undefined4 uStack_454;
  float local_44c;
  float x0_2;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  undefined8 *local_3c0;
  ImVector<stbtt_packedchar> buf_packedchars;
  float local_398;
  int y0_1;
  int x0_1;
  int iy0;
  stbrp_context *local_340;
  stbtt__point *local_338;
  ulong local_330;
  stbtt_packedchar *local_328;
  long local_320;
  ulong local_318;
  ulong local_310;
  ImFontConfig *local_308;
  stbtt__edge *local_300;
  uchar *local_2f8;
  long local_2f0;
  long local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  uchar *local_2d0;
  stbtt__edge *local_2c8;
  int local_2c0;
  int x1_1;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  stbtt__buf b;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  
  if ((atlas->ConfigData).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x829,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s",
                "atlas->ConfigData.Size > 0");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  src_tmp_array.Size = 0;
  src_tmp_array.Capacity = 0;
  src_tmp_array.Data = (ImFontBuildSrcData *)0x0;
  dst_tmp_array.Size = 0;
  dst_tmp_array.Capacity = 0;
  dst_tmp_array.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize(&src_tmp_array,(atlas->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&dst_tmp_array,(atlas->Fonts).Size);
  this = &atlas->ConfigData;
  this_00 = &atlas->Fonts;
  memset(src_tmp_array.Data,0,(long)src_tmp_array.Size * 0x110);
  memset(dst_tmp_array.Data,0,(long)dst_tmp_array.Size << 5);
  local_4a8 = this_00;
  for (i = 0; auVar118 = _local_4f8, iVar19 = this->Size, i < iVar19; i = i + 1) {
    pIVar61 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,i);
    pIVar62 = ImVector<ImFontConfig>::operator[](this,i);
    if ((pIVar62->DstFont == (ImFont *)0x0) ||
       (pIVar21 = pIVar62->DstFont->ContainerAtlas,
       pIVar21 != atlas && pIVar21 != (ImFontAtlas *)0x0)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                  ,0x841,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s",
                  "cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                 );
    }
    pIVar61->DstIndex = -1;
    iVar85 = 0;
    iVar55 = -1;
    while ((iVar85 < this_00->Size && (iVar55 == -1))) {
      pIVar22 = pIVar62->DstFont;
      ppIVar63 = ImVector<ImFont_*>::operator[](this_00,iVar85);
      if (pIVar22 == *ppIVar63) {
        pIVar61->DstIndex = iVar85;
        iVar55 = iVar85;
      }
      else {
        iVar55 = pIVar61->DstIndex;
      }
      iVar85 = iVar85 + 1;
    }
    if ((iVar55 == -1) &&
       (LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                    ,0x848,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s",
                    "src_tmp.DstIndex != -1"), pIVar61->DstIndex == -1)) goto LAB_001a8f4e;
    data = (stbtt_uint8 *)pIVar62->FontData;
    iVar55 = pIVar62->FontNo;
    sVar11 = *data;
    if (sVar11 == '\0') {
      bVar106 = data[1] == '\x01';
LAB_001a63ee:
      sVar54 = 0xffffffff;
      if ((!bVar106) || (sVar54 = 0xffffffff, data[2] != '\0')) goto LAB_001a6497;
      bVar106 = data[3] == '\0';
LAB_001a647f:
      sVar54 = 0xffffffff;
      if (!bVar106) goto LAB_001a6497;
      sVar54 = -(uint)(iVar55 != 0);
LAB_001a648f:
      if ((int)sVar54 < 0) goto LAB_001a6497;
    }
    else {
      if (sVar11 == 't') {
        sVar11 = data[1];
        if (sVar11 == 'r') {
          sVar54 = 0xffffffff;
          if (data[2] == 'u') {
            bVar106 = data[3] == 'e';
            goto LAB_001a647f;
          }
        }
        else if (sVar11 == 't') {
          sVar54 = 0xffffffff;
          if (((data[2] == 'c') && (sVar54 = 0xffffffff, data[3] == 'f')) &&
             ((sVar49 = ttULONG(data + 4), sVar49 == 0x20000 ||
              (sVar54 = 0xffffffff, sVar49 == 0x10000)))) {
            uVar86 = *(uint *)(data + 8);
            sVar54 = 0xffffffff;
            if (iVar55 < (int)(uVar86 >> 0x18 | (uVar86 & 0xff0000) >> 8 | (uVar86 & 0xff00) << 8 |
                              uVar86 << 0x18)) {
              sVar54 = ttULONG(data + (long)iVar55 * 4 + 0xc);
              goto LAB_001a648f;
            }
          }
        }
        else {
          sVar54 = 0xffffffff;
          if ((sVar11 == 'y') && (sVar54 = 0xffffffff, data[2] == 'p')) {
            bVar106 = data[3] == '1';
            goto LAB_001a647f;
          }
        }
      }
      else if (sVar11 == 'O') {
        sVar54 = 0xffffffff;
        if ((data[1] == 'T') && (sVar54 = 0xffffffff, data[2] == 'T')) {
          bVar106 = data[3] == 'O';
          goto LAB_001a647f;
        }
      }
      else {
        sVar54 = 0xffffffff;
        if (sVar11 == '1') {
          bVar106 = data[1] == '\0';
          goto LAB_001a63ee;
        }
      }
LAB_001a6497:
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                  ,0x84e,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s",
                  "font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"");
      data = (stbtt_uint8 *)pIVar62->FontData;
    }
    (pIVar61->FontInfo).data = data;
    (pIVar61->FontInfo).fontstart = sVar54;
    (pIVar61->FontInfo).cff.data = (uchar *)0x0;
    (pIVar61->FontInfo).cff.cursor = 0;
    (pIVar61->FontInfo).cff.size = 0;
    local_4f8._0_4_ = stbtt__find_table(data,sVar54,"cmap");
    local_4f8._4_4_ = extraout_var;
    stack0xfffffffffffffb10 = auVar118._8_8_;
    sVar49 = stbtt__find_table(data,sVar54,"loca");
    local_498._0_4_ = sVar49;
    (pIVar61->FontInfo).loca = sVar49;
    sVar49 = stbtt__find_table(data,sVar54,"head");
    (pIVar61->FontInfo).head = sVar49;
    sVar50 = stbtt__find_table(data,sVar54,"glyf");
    (pIVar61->FontInfo).glyf = sVar50;
    sVar51 = stbtt__find_table(data,sVar54,"hhea");
    (pIVar61->FontInfo).hhea = sVar51;
    sVar52 = stbtt__find_table(data,sVar54,"hmtx");
    (pIVar61->FontInfo).hmtx = sVar52;
    sVar53 = stbtt__find_table(data,sVar54,"kern");
    this_00 = local_4a8;
    (pIVar61->FontInfo).kern = sVar53;
    sVar53 = stbtt__find_table(data,sVar54,"GPOS");
    (pIVar61->FontInfo).gpos = sVar53;
    if ((((local_4f8._0_4_ == 0) || (sVar49 == 0)) || (sVar51 == 0)) || (sVar52 == 0))
    goto LAB_001a8f4e;
    if (sVar50 == 0) {
      _charstrings = (stbtt__active_edge *)((ulong)_charstrings & 0xffffffff00000000);
      fdarrayoff = 0;
      buf_packedchars.Size = 2;
      y1 = 0;
      sVar49 = stbtt__find_table(data,sVar54,"CFF ");
      if (sVar49 == 0) goto LAB_001a8f4e;
      (pIVar61->FontInfo).fdselect.data = (uchar *)0x0;
      (pIVar61->FontInfo).fdselect.cursor = 0;
      (pIVar61->FontInfo).fdselect.size = 0;
      (pIVar61->FontInfo).fontdicts.data = (uchar *)0x0;
      (pIVar61->FontInfo).fontdicts.cursor = 0;
      (pIVar61->FontInfo).fontdicts.size = 0;
      (pIVar61->FontInfo).cff.data = data + sVar49;
      (pIVar61->FontInfo).cff.cursor = 0;
      (pIVar61->FontInfo).cff.size = 0x20000000;
      puVar69 = (pIVar61->FontInfo).cff.data;
      uVar37 = (pIVar61->FontInfo).cff.cursor;
      uVar38 = (pIVar61->FontInfo).cff.size;
      b.data._0_4_ = (int)puVar69;
      b.data._4_4_ = (undefined4)((ulong)puVar69 >> 0x20);
      b.cursor = uVar37;
      b.size = uVar38;
      stbtt__buf_skip(&b,2);
      lVar64 = (long)b.cursor;
      uVar86 = 0;
      if (b.cursor < b.size) {
        b.cursor = b.cursor + 1;
        uVar86 = (uint)*(byte *)(CONCAT44(b.data._4_4_,(int)b.data) + lVar64);
      }
      stbtt__buf_seek(&b,uVar86);
      stbtt__cff_get_index(&b);
      sVar134 = stbtt__cff_get_index(&b);
      buf_rects = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar134,0);
      stbtt__cff_get_index(&b);
      sVar134 = stbtt__cff_get_index(&b);
      (pIVar61->FontInfo).gsubrs = sVar134;
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x11,1,&charstrings);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x106,1,(stbtt_uint32 *)&buf_packedchars);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x124,1,&fdarrayoff);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x125,1,(stbtt_uint32 *)&y1);
      sVar134.data._4_4_ = b.data._4_4_;
      sVar134.data._0_4_ = (int)b.data;
      sVar134.cursor = b.cursor;
      sVar134.size = b.size;
      sVar134 = stbtt__get_subrs(sVar134,(stbtt__buf)buf_rects);
      iVar55 = y1;
      (pIVar61->FontInfo).subrs = sVar134;
      if ((buf_packedchars.Size != 2) || (sVar49 = charstrings, charstrings == 0))
      goto LAB_001a8f4e;
      if (fdarrayoff != 0) {
        if (y1 == 0) goto LAB_001a8f4e;
        stbtt__buf_seek(&b,fdarrayoff);
        sVar134 = stbtt__cff_get_index(&b);
        (pIVar61->FontInfo).fontdicts = sVar134;
        sVar134 = stbtt__buf_range(&b,iVar55,b.size - iVar55);
        (pIVar61->FontInfo).fdselect = sVar134;
      }
      stbtt__buf_seek(&b,sVar49);
      sVar134 = stbtt__cff_get_index(&b);
      (pIVar61->FontInfo).charstrings = sVar134;
    }
    else if ((float)local_498._0_4_ == 0.0) goto LAB_001a8f4e;
    sVar54 = stbtt__find_table(data,sVar54,"maxp");
    if (sVar54 == 0) {
      uVar86 = 0xffff;
    }
    else {
      uVar86 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar54 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar54 + 4) >> 8);
    }
    (pIVar61->FontInfo).numGlyphs = uVar86;
    uVar74 = *(ushort *)(data + (ulong)(uint)local_4f8._0_4_ + 2);
    (pIVar61->FontInfo).index_map = 0;
    uVar103 = (ulong)(ushort)(uVar74 << 8 | uVar74 >> 8);
    uVar86 = local_4f8._0_4_ + 4;
    iVar55 = 0;
    while (bVar106 = uVar103 != 0, uVar103 = uVar103 - 1, bVar106) {
      uVar74 = *(ushort *)(data + uVar86) << 8 | *(ushort *)(data + uVar86) >> 8;
      if ((uVar74 == 0) ||
         ((uVar74 == 3 &&
          ((uVar74 = *(ushort *)(data + (ulong)uVar86 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar86 + 2) >> 8, uVar74 == 10 || (uVar74 == 1))))))
      {
        sVar54 = ttULONG(data + (ulong)uVar86 + 4);
        iVar55 = sVar54 + local_4f8._0_4_;
        (pIVar61->FontInfo).index_map = iVar55;
      }
      uVar86 = uVar86 + 8;
    }
    if (iVar55 == 0) goto LAB_001a8f4e;
    (pIVar61->FontInfo).indexToLocFormat =
         (uint)(ushort)(*(ushort *)(data + (long)(pIVar61->FontInfo).head + 0x32) << 8 |
                       *(ushort *)(data + (long)(pIVar61->FontInfo).head + 0x32) >> 8);
    pIVar65 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,pIVar61->DstIndex);
    pIVar80 = pIVar62->GlyphRanges;
    if (pIVar80 == (ImWchar *)0x0) {
      pIVar80 = ImFontAtlas::GetGlyphRangesDefault::ranges;
    }
    pIVar61->SrcRanges = pIVar80;
    uVar86 = pIVar61->GlyphsHighest;
    for (; (*pIVar80 != 0 && (uVar74 = pIVar80[1], uVar74 != 0)); pIVar80 = pIVar80 + 2) {
      if ((int)uVar86 <= (int)(uint)uVar74) {
        uVar86 = (uint)uVar74;
      }
      pIVar61->GlyphsHighest = uVar86;
    }
    pIVar65->SrcCount = pIVar65->SrcCount + 1;
    if ((int)uVar86 < pIVar65->GlyphsHighest) {
      uVar86 = pIVar65->GlyphsHighest;
    }
    pIVar65->GlyphsHighest = uVar86;
  }
  fVar101 = 0.0;
  for (iVar55 = 0; iVar55 < src_tmp_array.Size; iVar55 = iVar55 + 1) {
    pIVar61 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar55);
    local_4f8._0_4_ = iVar55;
    pIVar65 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,pIVar61->DstIndex);
    ImBitVector::Create(&pIVar61->GlyphsSet,pIVar61->GlyphsHighest + 1);
    this_01 = &pIVar65->GlyphsSet;
    if ((pIVar65->GlyphsSet).Storage.Size == 0) {
      ImBitVector::Create(this_01,pIVar65->GlyphsHighest + 1);
    }
    for (puVar83 = pIVar61->SrcRanges;
        (uVar86 = (uint)*puVar83, *puVar83 != 0 && (uVar74 = puVar83[1], uVar74 != 0));
        puVar83 = puVar83 + 2) {
      for (; uVar86 <= uVar74; uVar86 = uVar86 + 1) {
        bVar106 = ImBitVector::TestBit(this_01,uVar86);
        if ((!bVar106) && (iVar85 = stbtt_FindGlyphIndex(&pIVar61->FontInfo,uVar86), iVar85 != 0)) {
          pIVar61->GlyphsCount = pIVar61->GlyphsCount + 1;
          pIVar65->GlyphsCount = pIVar65->GlyphsCount + 1;
          ImBitVector::SetBit(&pIVar61->GlyphsSet,uVar86);
          ImBitVector::SetBit(this_01,uVar86);
          fVar101 = (float)((int)fVar101 + 1);
        }
        uVar74 = puVar83[1];
      }
    }
  }
  local_498._0_4_ = fVar101;
  for (iVar55 = 0; iVar55 < src_tmp_array.Size; iVar55 = iVar55 + 1) {
    local_4f8._0_4_ = iVar55;
    pIVar61 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar55);
    ImVector<int>::reserve(&pIVar61->GlyphsList,pIVar61->GlyphsCount);
    puVar84 = (pIVar61->GlyphsSet).Storage.Data;
    puVar1 = puVar84 + (pIVar61->GlyphsSet).Storage.Size;
    iVar85 = 0;
    for (; puVar84 < puVar1; puVar84 = puVar84 + 1) {
      uVar86 = *puVar84;
      if (uVar86 != 0) {
        for (uVar98 = 0; uVar98 != 0x20; uVar98 = uVar98 + 1) {
          if ((uVar86 >> (uVar98 & 0x1f) & 1) != 0) {
            b.data._0_4_ = iVar85 + uVar98;
            ImVector<int>::push_back(&pIVar61->GlyphsList,(int *)&b);
          }
        }
      }
      iVar85 = iVar85 + 0x20;
    }
    ImVector<unsigned_int>::clear(&(pIVar61->GlyphsSet).Storage);
    if ((pIVar61->GlyphsList).Size != pIVar61->GlyphsCount) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                  ,0x87d,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s",
                  "src_tmp.GlyphsList.Size == src_tmp.GlyphsCount");
    }
    fVar101 = (float)local_498._0_4_;
  }
  for (iVar55 = 0; iVar55 < dst_tmp_array.Size; iVar55 = iVar55 + 1) {
    pIVar65 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,iVar55);
    ImVector<unsigned_int>::clear(&(pIVar65->GlyphsSet).Storage);
  }
  ImVector<ImFontBuildDstData>::clear(&dst_tmp_array);
  buf_rects = (ImVector<stbrp_rect>)ZEXT816(0);
  buf_packedchars.Size = 0;
  buf_packedchars.Capacity = 0;
  buf_packedchars.Data = (stbtt_packedchar *)0x0;
  ImVector<stbrp_rect>::resize(&buf_rects,(int)fVar101);
  ImVector<stbtt_packedchar>::resize(&buf_packedchars,(int)fVar101);
  memset(buf_rects.Data,0,(long)buf_rects.Size << 4);
  memset(buf_packedchars.Data,0,(long)buf_packedchars.Size * 0x1c);
  local_4a8 = (ImVector<ImFont_*> *)((ulong)local_4a8 & 0xffffffff00000000);
  auVar118._12_4_ = 0;
  auVar118._0_12_ = local_498._4_12_;
  local_498._0_16_ = auVar118 << 0x20;
  local_4d8 = 0;
  for (iVar55 = 0; iVar55 < src_tmp_array.Size; iVar55 = iVar55 + 1) {
    pIVar61 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar55);
    if (pIVar61->GlyphsCount != 0) {
      psVar66 = ImVector<stbrp_rect>::operator[](&buf_rects,local_498._0_4_);
      pIVar61->Rects = psVar66;
      psVar67 = ImVector<stbtt_packedchar>::operator[](&buf_packedchars,(uint)local_4a8);
      pIVar61->PackedChars = psVar67;
      iVar85 = pIVar61->GlyphsCount;
      pIVar62 = ImVector<ImFontConfig>::operator[](this,iVar55);
      fVar101 = pIVar62->SizePixels;
      (pIVar61->PackRange).font_size = fVar101;
      (pIVar61->PackRange).first_unicode_codepoint_in_range = 0;
      (pIVar61->PackRange).array_of_unicode_codepoints = (pIVar61->GlyphsList).Data;
      iVar56 = (pIVar61->GlyphsList).Size;
      (pIVar61->PackRange).num_chars = iVar56;
      (pIVar61->PackRange).chardata_for_range = pIVar61->PackedChars;
      (pIVar61->PackRange).h_oversample = (uchar)pIVar62->OversampleH;
      (pIVar61->PackRange).v_oversample = (uchar)pIVar62->OversampleV;
      if (fVar101 <= 0.0) {
        local_4f8._4_4_ = 0x80000000;
        local_4f8._8_4_ = 0x80000000;
        uStack_4ec = 0x80000000;
        uVar74 = *(ushort *)((pIVar61->FontInfo).data + (long)(pIVar61->FontInfo).head + 0x12);
        local_4f8._0_4_ = -fVar101 / (float)(ushort)(uVar74 << 8 | uVar74 >> 8);
      }
      else {
        local_4f8._0_4_ = stbtt_ScaleForPixelHeight(&pIVar61->FontInfo,fVar101);
        local_4f8._4_4_ = extraout_XMM0_Db;
        local_4f8._8_4_ = extraout_XMM0_Dc;
        uStack_4ec = extraout_XMM0_Dd;
      }
      local_498._0_4_ = local_498._0_4_ + iVar85;
      local_4a8 = (ImVector<ImFont_*> *)CONCAT44(local_4a8._4_4_,(uint)local_4a8 + iVar85);
      iVar85 = atlas->TexGlyphPadding;
      lVar64 = 6;
      for (lVar94 = 0; lVar94 < iVar56; lVar94 = lVar94 + 1) {
        piVar68 = ImVector<int>::operator[](&pIVar61->GlyphsList,(int)lVar94);
        iVar56 = stbtt_FindGlyphIndex(&pIVar61->FontInfo,*piVar68);
        if (iVar56 == 0) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                      ,0x8ac,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s",
                      "glyph_index_in_font != 0");
        }
        stbtt_GetGlyphBitmapBoxSubpixel
                  (&pIVar61->FontInfo,iVar56,(float)pIVar62->OversampleH * (float)local_4f8._0_4_,
                   (float)pIVar62->OversampleV * (float)local_4f8._0_4_,(float)local_4f8._0_4_,
                   in_XMM3_Da,(int *)&b,(int *)&charstrings,(int *)&fdarrayoff,&y1);
        uVar86 = (pIVar62->OversampleH + ((fdarrayoff + iVar85) - (int)b.data)) - 1;
        psVar66 = pIVar61->Rects;
        *(short *)((long)psVar66 + lVar64 + -2) = (short)uVar86;
        uVar98 = (pIVar62->OversampleV + ((y1 + iVar85) - charstrings)) - 1;
        *(short *)((long)&psVar66->id + lVar64) = (short)uVar98;
        local_4d8 = local_4d8 + (uVar98 & 0xffff) * (uVar86 & 0xffff);
        iVar56 = (pIVar61->GlyphsList).Size;
        lVar64 = lVar64 + 0x10;
      }
    }
  }
  atlas->TexHeight = 0;
  iVar55 = atlas->TexDesiredWidth;
  if (iVar55 < 1) {
    iVar85 = (int)SQRT((float)local_4d8);
    iVar55 = 0x1000;
    if ((iVar85 < 0xb33) && (iVar55 = 0x800, iVar85 < 0x599)) {
      iVar55 = (uint)(0x2cb < iVar85) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar55;
  uVar86 = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar85 = iVar55 - uVar86;
  local_4b8 = (stbrp_node *)ImGui::MemAlloc((long)iVar85 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_4b8 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_4b8 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_4b8);
    }
    local_4b8 = (stbrp_node *)0x0;
    uVar86 = 0;
    iVar55 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (((int)uVar86 < -0x7fff) || (0xffff < iVar85)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                  ,0x10a,"stbrp_init_target","ImGui ASSERT FAILED: %s",
                  "width <= 0xffff && height <= 0xffff");
    }
    uVar98 = iVar85 - 1;
    uVar91 = 0;
    psVar97 = local_4b8;
    uVar103 = uVar91;
    if (0 < (int)uVar98) {
      uVar91 = (ulong)uVar98;
      uVar103 = uVar91;
    }
    while( true ) {
      bVar106 = uVar91 == 0;
      uVar91 = uVar91 - 1;
      if (bVar106) break;
      psVar97->next = psVar97 + 1;
      psVar97 = psVar97 + 1;
    }
    local_4b8[uVar103].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_4b8;
    ptr->active_head = ptr->extra;
    ptr->width = iVar85;
    ptr->height = 0x8000 - uVar86;
    ptr->num_nodes = iVar85;
    ptr->align = (int)(uVar98 + iVar85) / iVar85;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar85;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_340 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  for (iVar85 = 0; iVar85 < src_tmp_array.Size; iVar85 = iVar85 + 1) {
    pIVar61 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar85);
    if (pIVar61->GlyphsCount != 0) {
      stbrp_pack_rects(local_340,pIVar61->Rects,pIVar61->GlyphsCount);
      psVar66 = pIVar61->Rects;
      uVar103 = (ulong)(uint)pIVar61->GlyphsCount;
      if (pIVar61->GlyphsCount < 1) {
        uVar103 = 0;
      }
      for (lVar64 = 0; uVar103 * 0x10 != lVar64; lVar64 = lVar64 + 0x10) {
        if (*(int *)((long)&psVar66->was_packed + lVar64) != 0) {
          iVar56 = (uint)*(ushort *)((long)&psVar66->h + lVar64) +
                   (uint)*(ushort *)((long)&psVar66->y + lVar64);
          if (iVar56 < atlas->TexHeight) {
            iVar56 = atlas->TexHeight;
          }
          atlas->TexHeight = iVar56;
        }
      }
    }
  }
  uVar98 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar98 = (int)(uVar98 - 1) >> 1 | uVar98 - 1;
    uVar98 = (int)uVar98 >> 2 | uVar98;
    uVar98 = (int)uVar98 >> 4 | uVar98;
    uVar98 = (int)uVar98 >> 8 | uVar98;
    uVar98 = (int)uVar98 >> 0x10 | uVar98;
  }
  iVar85 = uVar98 + 1;
  atlas->TexHeight = iVar85;
  auVar120._0_4_ = (float)atlas->TexWidth;
  auVar120._4_4_ = (float)iVar85;
  auVar120._8_8_ = 0;
  auVar118 = divps(_DAT_00214290,auVar120);
  atlas->TexUvScale = auVar118._0_8_;
  puVar69 = (uchar *)ImGui::MemAlloc((long)(iVar85 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar69;
  memset(puVar69,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  puVar69 = atlas->TexPixelsAlpha8;
  lVar64 = (long)iVar55;
  auVar118 = pshuflw(ZEXT416(uVar86),ZEXT416(uVar86),0);
  local_2f8 = puVar69 + 1;
  psVar97 = local_4b8;
  for (iVar85 = 0; iVar85 < src_tmp_array.Size; iVar85 = iVar85 + 1) {
    local_308 = ImVector<ImFontConfig>::operator[](this,iVar85);
    pIVar61 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar85);
    if (pIVar61->GlyphsCount != 0) {
      psVar66 = pIVar61->Rects;
      bVar106 = true;
      lVar94 = 0;
      while (bVar106) {
        fVar101 = (pIVar61->PackRange).font_size;
        if (fVar101 <= 0.0) {
          uVar74 = *(ushort *)((pIVar61->FontInfo).data + (long)(pIVar61->FontInfo).head + 0x12);
          fVar101 = -fVar101 / (float)(ushort)(uVar74 << 8 | uVar74 >> 8);
        }
        else {
          fVar101 = stbtt_ScaleForPixelHeight(&pIVar61->FontInfo,fVar101);
        }
        uVar103._0_1_ = (pIVar61->PackRange).h_oversample;
        uVar24 = (pIVar61->PackRange).v_oversample;
        uVar25 = *(undefined6 *)&(pIVar61->PackRange).field_0x22;
        uVar103._1_7_ = CONCAT61(uVar25,uVar24);
        auVar28._8_6_ = 0;
        auVar28._0_8_ = uVar103;
        auVar28[0xe] = (char)((uint6)uVar25 >> 0x28);
        auVar30._8_4_ = 0;
        auVar30._0_8_ = uVar103;
        auVar30[0xc] = (char)((uint6)uVar25 >> 0x20);
        auVar30._13_2_ = auVar28._13_2_;
        auVar31._8_4_ = 0;
        auVar31._0_8_ = uVar103;
        auVar31._12_3_ = auVar30._12_3_;
        auVar32._8_2_ = 0;
        auVar32._0_8_ = uVar103;
        auVar32[10] = (char)((uint6)uVar25 >> 0x18);
        auVar32._11_4_ = auVar31._11_4_;
        auVar33._8_2_ = 0;
        auVar33._0_8_ = uVar103;
        auVar33._10_5_ = auVar32._10_5_;
        auVar34[8] = (char)((uint6)uVar25 >> 0x10);
        auVar34._0_8_ = uVar103;
        auVar34._9_6_ = auVar33._9_6_;
        auVar39._7_8_ = 0;
        auVar39._0_7_ = auVar34._8_7_;
        cVar114 = (char)((uint6)uVar25 >> 8);
        Var40 = CONCAT81(SUB158(auVar39 << 0x40,7),cVar114);
        auVar45._9_6_ = 0;
        auVar45._0_9_ = Var40;
        cVar112 = (char)uVar25;
        auVar35[4] = cVar112;
        auVar35._0_4_ = (uint)uVar103;
        auVar35._5_10_ = SUB1510(auVar45 << 0x30,5);
        auVar41._11_4_ = 0;
        auVar41._0_11_ = auVar35._4_11_;
        auVar42._1_12_ = SUB1512(auVar41 << 0x20,3);
        auVar42[0] = uVar24;
        uVar74 = CONCAT11(0,(undefined1)uVar103);
        auVar36._2_13_ = auVar42;
        auVar36._0_2_ = uVar74;
        uVar75 = auVar42._0_2_;
        sVar113 = -auVar35._4_2_;
        sVar115 = (short)Var40;
        sVar27 = -sVar115;
        auVar29._10_2_ = 0;
        auVar29._0_10_ = auVar36._0_10_;
        auVar29._12_2_ = sVar115;
        uVar47 = CONCAT42(auVar29._10_4_,auVar35._4_2_);
        auVar43._6_8_ = 0;
        auVar43._0_6_ = uVar47;
        auVar110._0_4_ = (float)uVar74;
        auVar110._4_4_ = (float)(int)CONCAT82(SUB148(auVar43 << 0x40,6),uVar75);
        auVar110._8_4_ = (float)(int)uVar47;
        auVar110._12_4_ = (float)(auVar29._10_4_ >> 0x10);
        auVar126 = divps(_DAT_00214290,auVar110);
        auVar133[0] = -((undefined1)uVar103 == 0);
        auVar133[1] = -((undefined1)uVar103 == 0);
        auVar133[2] = -((undefined1)uVar103 == 0);
        auVar133[3] = -((undefined1)uVar103 == 0);
        auVar133[4] = -(uVar24 == '\0');
        auVar133[5] = -(uVar24 == '\0');
        auVar133[6] = -(uVar24 == '\0');
        auVar133[7] = -(uVar24 == '\0');
        auVar133[8] = -(cVar112 == '\0');
        auVar133[9] = -(cVar112 == '\0');
        auVar133[10] = -(cVar112 == '\0');
        auVar133[0xb] = -(cVar112 == '\0');
        auVar133[0xc] = -(cVar114 == '\0');
        auVar133[0xd] = -(cVar114 == '\0');
        auVar133[0xe] = -(cVar114 == '\0');
        auVar133[0xf] = -(cVar114 == '\0');
        Var46 = CONCAT64(CONCAT42(CONCAT22(sVar27,sVar27),sVar113),CONCAT22(sVar113,sVar27));
        auVar44._4_8_ = (long)((unkuint10)Var46 >> 0x10);
        auVar44._2_2_ = 1 - uVar75;
        auVar44._0_2_ = 1 - uVar75;
        auVar119._0_4_ = (float)(int)(short)(1 - uVar74);
        auVar119._4_4_ = (float)(auVar44._0_4_ >> 0x10);
        auVar119._8_4_ = (float)((int)((unkuint10)Var46 >> 0x10) >> 0x10);
        auVar119._12_4_ = (float)(int)sVar27;
        fVar131 = fVar101 * auVar110._0_4_;
        local_2b8 = fVar101 * auVar110._4_4_;
        fStack_2a0 = fVar101 * auVar110._8_4_;
        fStack_29c = fVar101 * auVar110._12_4_;
        auVar109._0_4_ = auVar110._0_4_ + auVar110._0_4_;
        auVar109._4_4_ = auVar110._4_4_ + auVar110._4_4_;
        auVar109._8_4_ = auVar110._8_4_ + auVar110._8_4_;
        auVar109._12_4_ = auVar110._12_4_ + auVar110._12_4_;
        auVar120 = divps(auVar119,auVar109);
        lVar94 = (long)(int)lVar94;
        fVar116 = local_2b8;
        if (fVar131 <= local_2b8) {
          fVar116 = fVar131;
        }
        fVar116 = (0.35 / fVar116) * (0.35 / fVar116);
        fVar123 = -local_2b8;
        local_310 = uVar103 & 0xff;
        local_318 = (ulong)((uint)uVar103._1_7_ & 0xff);
        local_4a8 = (ImVector<ImFont_*> *)(ulong)((uint)uVar103 & 0xff);
        lVar92 = 0;
        local_58 = fVar131;
        fStack_2b4 = local_2b8;
        fStack_2b0 = local_2b8;
        fStack_2ac = local_2b8;
        local_2a8 = fVar131;
        fStack_2a4 = local_2b8;
LAB_001a7300:
        if (lVar92 < (pIVar61->PackRange).num_chars) {
          if (((psVar66[lVar94].was_packed != 0) && (psVar66[lVar94].w != 0)) &&
             (psVar66[lVar94].h != 0)) {
            piVar68 = (pIVar61->PackRange).array_of_unicode_codepoints;
            if (piVar68 == (int *)0x0) {
              iVar56 = (pIVar61->PackRange).first_unicode_codepoint_in_range + (int)lVar92;
            }
            else {
              iVar56 = piVar68[lVar92];
            }
            local_328 = (pIVar61->PackRange).chardata_for_range + lVar92;
            local_320 = lVar94;
            iVar57 = stbtt_FindGlyphIndex(&pIVar61->FontInfo,iVar56);
            psVar48 = psVar66 + lVar94;
            uVar3 = psVar48->w;
            uVar7 = psVar48->h;
            uVar8 = psVar48->x;
            uVar10 = psVar48->y;
            psVar48 = psVar66 + lVar94;
            psVar48->w = uVar3 - auVar118._0_2_;
            psVar48->h = uVar7 - auVar118._2_2_;
            psVar48->x = uVar8 + auVar118._4_2_;
            psVar48->y = uVar10 + auVar118._6_2_;
            puVar105 = (pIVar61->FontInfo).data;
            uVar74 = *(ushort *)(puVar105 + (long)(pIVar61->FontInfo).hhea + 0x22) << 8 |
                     *(ushort *)(puVar105 + (long)(pIVar61->FontInfo).hhea + 0x22) >> 8;
            iVar56 = (pIVar61->FontInfo).hmtx;
            lVar72 = (ulong)uVar74 * 4 + (long)iVar56 + -4;
            lVar95 = (ulong)uVar74 * 4 + (long)iVar56 + -3;
            if (iVar57 < (int)(uint)uVar74) {
              lVar72 = (long)(iVar57 * 4) + (long)iVar56;
              lVar95 = (long)(iVar57 * 4) + 1 + (long)iVar56;
            }
            uVar12 = puVar105[lVar72];
            uVar13 = puVar105[lVar95];
            auVar110 = auVar118;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar61->FontInfo,iVar57,local_2a8,local_2b8,auVar118._0_4_,local_58,&x0_1,
                       &y0_1,&x1_1,&local_2c0);
            fVar107 = auVar110._0_4_;
            uVar74 = psVar66[lVar94].x;
            uVar16 = psVar66[lVar94].y;
            uVar17 = psVar66[lVar94].w;
            uVar18 = psVar66[lVar94].h;
            uVar86 = stbtt_GetGlyphShape(&pIVar61->FontInfo,iVar57,(stbtt_vertex **)&fdarrayoff);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar61->FontInfo,iVar57,local_2a8,local_2b8,fVar107,local_58,&y1,&iy0,
                       (int *)0x0,(int *)0x0);
            iVar56 = y1;
            local_47c = ((uint)uVar17 - (int)local_4a8) + 1;
            uVar98 = (uint)uVar75;
            if ((local_47c != 0) && (iVar57 = (uVar18 - uVar98) + 1, iVar57 != 0)) {
              local_2d0 = puVar69 + (ulong)uVar16 * lVar64 + (ulong)uVar74;
              iVar58 = (uint)uVar17 - (int)local_4a8;
              lVar72 = CONCAT44(uStack_454,fdarrayoff);
              local_330 = (ulong)(uint)iy0;
              uVar91 = 0;
              uVar103 = (ulong)uVar86;
              if ((int)uVar86 < 1) {
                uVar103 = uVar91;
              }
              uVar78 = 0;
              for (; uVar103 * 0xe - uVar91 != 0; uVar91 = uVar91 + 0xe) {
                uVar78 = (ulong)((int)uVar78 + (uint)(*(char *)(lVar72 + 0xc + uVar91) == '\x01'));
              }
              if (((int)uVar78 != 0) &&
                 (ptr_00 = ImGui::MemAlloc(uVar78 * 4), ptr_00 != (void *)0x0)) {
                points = (stbtt__point *)0x0;
                iVar59 = 0;
                iVar76 = 0;
                iVar81 = 0;
                do {
                  if (iVar76 == 1) {
                    points = (stbtt__point *)ImGui::MemAlloc((long)iVar81 << 3);
                    if (points == (stbtt__point *)0x0) {
                      ImGui::MemFree((void *)0x0);
                      ImGui::MemFree(ptr_00);
                      break;
                    }
                  }
                  else if (iVar76 == 2) goto LAB_001a777e;
                  local_4f8._0_4_ = iVar76;
                  b.data._0_4_ = 0;
                  fVar107 = 0.0;
                  fVar108 = 0.0;
                  uVar86 = 0xffffffff;
                  for (lVar95 = 0; uVar103 * 0xe - lVar95 != 0; lVar95 = lVar95 + 0xe) {
                    iVar81 = (int)b.data;
                    switch(*(undefined1 *)(lVar72 + 0xc + lVar95)) {
                    case 1:
                      if (-1 < (int)uVar86) {
                        *(int *)((long)ptr_00 + (ulong)uVar86 * 4) = (int)b.data - iVar59;
                      }
                      uVar86 = uVar86 + 1;
                      auVar110 = pshuflw(ZEXT416(*(uint *)(lVar72 + lVar95)),
                                         ZEXT416(*(uint *)(lVar72 + lVar95)),0x60);
                      fVar107 = (float)(auVar110._0_4_ >> 0x10);
                      fVar108 = (float)(auVar110._4_4_ >> 0x10);
                      iVar59 = (int)b.data;
                      iVar81 = (int)b.data + 1;
                      if (points != (stbtt__point *)0x0) {
                        points[(int)b.data].x = fVar107;
                        points[(int)b.data].y = fVar108;
                      }
                      break;
                    case 2:
                      auVar110 = pshuflw(ZEXT416(*(uint *)(lVar72 + lVar95)),
                                         ZEXT416(*(uint *)(lVar72 + lVar95)),0x60);
                      fVar107 = (float)(auVar110._0_4_ >> 0x10);
                      fVar108 = (float)(auVar110._4_4_ >> 0x10);
                      iVar81 = (int)b.data + 1;
                      if (points != (stbtt__point *)0x0) {
                        points[(int)b.data].x = fVar107;
                        points[(int)b.data].y = fVar108;
                      }
                      break;
                    case 3:
                      stbtt__tesselate_curve
                                (points,(int *)&b,fVar107,fVar108,
                                 (float)(int)*(short *)(lVar72 + 4 + lVar95),
                                 (float)(int)*(short *)(lVar72 + 6 + lVar95),
                                 (float)(int)*(short *)(lVar72 + lVar95),
                                 (float)(int)*(short *)(lVar72 + 2 + lVar95),fVar116,0);
                      goto LAB_001a7708;
                    case 4:
                      stbtt__tesselate_cubic
                                (points,(int *)&b,fVar107,fVar108,
                                 (float)(int)*(short *)(lVar72 + 4 + lVar95),
                                 (float)(int)*(short *)(lVar72 + 6 + lVar95),
                                 (float)(int)*(short *)(lVar72 + 8 + lVar95),
                                 (float)(int)*(short *)(lVar72 + 10 + lVar95),
                                 (float)(int)*(short *)(lVar72 + lVar95),
                                 (float)(int)*(short *)(lVar72 + 2 + lVar95),fVar116,0);
LAB_001a7708:
                      auVar110 = pshuflw(ZEXT416(*(uint *)(lVar72 + lVar95)),
                                         ZEXT416(*(uint *)(lVar72 + lVar95)),0x60);
                      fVar107 = (float)(auVar110._0_4_ >> 0x10);
                      fVar108 = (float)(auVar110._4_4_ >> 0x10);
                      iVar81 = (int)b.data;
                    }
                    b.data._0_4_ = iVar81;
                  }
                  *(int *)((long)ptr_00 + (long)(int)uVar86 * 4) = (int)b.data - iVar59;
                  iVar76 = iVar76 + 1;
                  iVar81 = (int)b.data;
                } while( true );
              }
            }
            goto LAB_001a85b6;
          }
          goto LAB_001a8bd0;
        }
        bVar106 = false;
      }
      fVar101 = local_308->RasterizerMultiply;
      if ((fVar101 != 1.0) || (NAN(fVar101))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&b,fVar101);
        piVar68 = &pIVar61->Rects->was_packed;
        for (iVar56 = 0; iVar56 < pIVar61->GlyphsCount; iVar56 = iVar56 + 1) {
          if (*piVar68 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&b,atlas->TexPixelsAlpha8,(uint)*(ushort *)(piVar68 + -1),
                       (uint)*(stbrp_coord *)((long)piVar68 + -2),(uint)*(ushort *)(piVar68 + -2),
                       (uint)*(stbrp_coord *)((long)piVar68 + -6),atlas->TexWidth);
          }
          piVar68 = piVar68 + 4;
        }
      }
      pIVar61->Rects = (stbrp_rect *)0x0;
    }
  }
  ImGui::MemFree(psVar97);
  ImGui::MemFree(local_340);
  ImVector<stbrp_rect>::clear(&buf_rects);
  for (iVar55 = 0; iVar55 < src_tmp_array.Size; iVar55 = iVar55 + 1) {
    pIVar61 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar55);
    if (pIVar61->GlyphsCount != 0) {
      pIVar62 = ImVector<ImFontConfig>::operator[](this,iVar55);
      pIVar22 = pIVar62->DstFont;
      fVar101 = stbtt_ScaleForPixelHeight(&pIVar61->FontInfo,pIVar62->SizePixels);
      puVar69 = (pIVar61->FontInfo).data;
      lVar64 = (long)(pIVar61->FontInfo).hhea;
      uVar74 = *(ushort *)(puVar69 + lVar64 + 4);
      uVar74 = uVar74 << 8 | uVar74 >> 8;
      fVar116 = -1.0;
      if (0 < (short)uVar74) {
        fVar116 = 1.0;
      }
      uVar75 = *(ushort *)(puVar69 + lVar64 + 6);
      uVar75 = uVar75 << 8 | uVar75 >> 8;
      fVar131 = -1.0;
      if (0 < (short)uVar75) {
        fVar131 = 1.0;
      }
      ImFontAtlasBuildSetupFont
                (atlas,pIVar22,pIVar62,(float)(int)((float)(int)(short)uVar74 * fVar101 + fVar116),
                 (float)(int)((float)(int)(short)uVar75 * fVar101 + fVar131));
      fVar101 = (pIVar62->GlyphOffset).x;
      fVar116 = (float)(int)(pIVar22->Ascent + 0.5) + (pIVar62->GlyphOffset).y;
      lVar64 = 0;
      for (lVar94 = 0; lVar94 < pIVar61->GlyphsCount; lVar94 = lVar94 + 1) {
        piVar68 = ImVector<int>::operator[](&pIVar61->GlyphsList,(int)lVar94);
        psVar67 = pIVar61->PackedChars;
        fVar131 = *(float *)((long)&psVar67->xadvance + lVar64);
        fVar123 = pIVar62->GlyphMaxAdvanceX;
        if (fVar131 <= pIVar62->GlyphMaxAdvanceX) {
          fVar123 = fVar131;
        }
        uVar86 = -(uint)(fVar131 < pIVar62->GlyphMinAdvanceX);
        fVar123 = (float)(uVar86 & (uint)pIVar62->GlyphMinAdvanceX | ~uVar86 & (uint)fVar123);
        if ((fVar131 != fVar123) || (fVar107 = fVar101, NAN(fVar131) || NAN(fVar123))) {
          fVar107 = (fVar123 - fVar131) * 0.5;
          if (pIVar62->PixelSnapH != false) {
            fVar107 = (float)(int)fVar107;
          }
          fVar107 = fVar107 + fVar101;
        }
        fVar108 = 1.0 / (float)atlas->TexHeight;
        fVar131 = 1.0 / (float)atlas->TexWidth;
        ImFont::AddGlyph(pIVar22,(ImWchar)*piVar68,
                         *(float *)((long)&psVar67->xoff + lVar64) + 0.0 + fVar107,
                         *(float *)((long)&psVar67->yoff + lVar64) + 0.0 + fVar116,
                         *(float *)((long)&psVar67->xoff2 + lVar64) + 0.0 + fVar107,
                         *(float *)((long)&psVar67->yoff2 + lVar64) + 0.0 + fVar116,
                         (float)*(ushort *)((long)&psVar67->x0 + lVar64) * fVar131,
                         (float)*(ushort *)((long)&psVar67->y0 + lVar64) * fVar108,
                         (float)*(ushort *)((long)&psVar67->x1 + lVar64) * fVar131,
                         (float)*(ushort *)((long)&psVar67->y1 + lVar64) * fVar108,fVar123);
        lVar64 = lVar64 + 0x1c;
      }
    }
  }
  for (iVar55 = 0; iVar55 < src_tmp_array.Size; iVar55 = iVar55 + 1) {
    pIVar61 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar55);
    ImFontBuildSrcData::~ImFontBuildSrcData(pIVar61);
  }
  ImFontAtlasBuildFinish(atlas);
  ImVector<stbtt_packedchar>::~ImVector(&buf_packedchars);
  ImVector<stbrp_rect>::~ImVector(&buf_rects);
LAB_001a8f4e:
  ImVector<ImFontBuildDstData>::~ImVector(&dst_tmp_array);
  ImVector<ImFontBuildSrcData>::~ImVector(&src_tmp_array);
  return iVar19 <= i;
LAB_001a777e:
  if (points != (stbtt__point *)0x0) {
    iVar59 = 0;
    for (uVar103 = 0; uVar78 != uVar103; uVar103 = uVar103 + 1) {
      iVar59 = iVar59 + *(int *)((long)ptr_00 + uVar103 * 4);
    }
    p = (stbtt__edge *)ImGui::MemAlloc((long)(iVar59 + 1) * 0x14);
    if (p != (stbtt__edge *)0x0) {
      iVar59 = 0;
      iVar81 = 0;
      for (uVar103 = 0; uVar103 != uVar78; uVar103 = uVar103 + 1) {
        iVar76 = *(int *)((long)ptr_00 + uVar103 * 4);
        uVar89 = (ulong)(iVar76 - 1);
        iVar102 = iVar76;
        for (uVar91 = 0; iVar60 = (int)uVar89, (long)uVar91 < (long)iVar102; uVar91 = uVar91 + 1) {
          fVar107 = points[(long)iVar59 + (long)iVar60].y;
          fVar108 = points[(long)iVar59 + uVar91].y;
          if ((fVar107 != fVar108) || (NAN(fVar107) || NAN(fVar108))) {
            iVar93 = (int)uVar91;
            iVar102 = iVar60;
            if (fVar107 <= fVar108) {
              iVar102 = iVar93;
              iVar93 = iVar60;
            }
            p[iVar81].invert = (uint)(fVar108 < fVar107);
            sVar5 = points[(long)iVar59 + (long)iVar102];
            sVar6 = points[(long)iVar59 + (long)iVar93];
            psVar70 = p + iVar81;
            psVar70->x0 = sVar5.x * fVar131 + 0.0;
            psVar70->y0 = sVar5.y * fVar123 + 0.0;
            psVar70->x1 = sVar6.x * fVar131 + 0.0;
            psVar70->y1 = sVar6.y * fVar123 + 0.0;
            iVar81 = iVar81 + 1;
            iVar102 = *(int *)((long)ptr_00 + uVar103 * 4);
          }
          uVar89 = uVar91 & 0xffffffff;
        }
        iVar59 = iVar76 + iVar59;
      }
      local_338 = points;
      stbtt__sort_edges_quicksort(p,iVar81);
      psVar70 = p;
      for (uVar103 = 1; (long)uVar103 < (long)iVar81; uVar103 = uVar103 + 1) {
        uVar4 = p[uVar103].x0;
        uVar9 = p[uVar103].y0;
        b.cursor = p[uVar103].invert;
        uVar20 = p[uVar103].x1;
        uVar26 = p[uVar103].y1;
        psVar88 = psVar70;
        for (uVar91 = uVar103; 0 < (long)uVar91; uVar91 = uVar91 - 1) {
          if (psVar88->y0 <= (float)uVar9) goto LAB_001a7926;
          psVar88[1].invert = psVar88->invert;
          fVar107 = psVar88->y0;
          fVar108 = psVar88->x1;
          fVar130 = psVar88->y1;
          psVar88[1].x0 = psVar88->x0;
          psVar88[1].y0 = fVar107;
          psVar88[1].x1 = fVar108;
          psVar88[1].y1 = fVar130;
          psVar88 = psVar88 + -1;
        }
        uVar91 = 0;
LAB_001a7926:
        iVar59 = (int)uVar91;
        if (uVar103 != (uVar91 & 0xffffffff)) {
          p[iVar59].x0 = (float)uVar4;
          p[iVar59].y0 = (float)uVar9;
          p[iVar59].x1 = (float)uVar20;
          p[iVar59].y1 = (float)uVar26;
          p[iVar59].invert = b.cursor;
        }
        psVar70 = psVar70 + 1;
        b.data._0_4_ = uVar20;
        b.data._4_4_ = uVar26;
      }
      _charstrings = (stbtt__active_edge *)0x0;
      scanline_00 = &b;
      if (0x3f < iVar58) {
        scanline_00 = (stbtt__buf *)ImGui::MemAlloc((ulong)local_47c * 8 + 4);
      }
      local_2e8 = (long)(int)local_47c;
      scanline = (float *)((long)&scanline_00->data + local_2e8 * 4);
      p[iVar81].y0 = (float)((int)local_330 + iVar57) + 1.0;
      local_2d8 = local_2e8 * 4;
      local_2e0 = (long)iVar58 * 4 + 8;
      local_44c = (float)(int)local_47c;
      if ((int)local_47c < 1) {
        local_47c = 0;
      }
      local_2f0 = 0;
      if (0 < local_2e8) {
        local_2f0 = local_2e8;
      }
      iVar59 = 0;
      if (iVar57 < 1) {
        iVar57 = 0;
      }
      psVar99 = (stbtt__active_edge *)0x0;
      iVar81 = 0;
      local_3c0 = (undefined8 *)0x0;
      uVar103 = local_330 & 0xffffffff;
      local_300 = p;
      for (iVar76 = 0; psVar70 = local_300, iVar76 != iVar57; iVar76 = iVar76 + 1) {
        fVar107 = (float)(int)uVar103;
        memset(scanline_00,0,local_2d8);
        memset(scanline,0,local_2e0);
        psVar87 = (stbtt__active_edge *)&charstrings;
        while (psVar104 = psVar87, puVar105 = local_2d0, psVar23 = psVar104->next,
              psVar23 != (stbtt__active_edge *)0x0) {
          psVar87 = psVar23;
          if (psVar23->ey <= fVar107) {
            psVar104->next = psVar23->next;
            if ((psVar23->direction == 0.0) && (!NAN(psVar23->direction))) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                          ,0xc63,"stbtt__rasterize_sorted_edges","ImGui ASSERT FAILED: %s",
                          "bool(z->direction)");
            }
            psVar23->direction = 0.0;
            psVar23->next = psVar99;
            psVar87 = psVar104;
            psVar99 = psVar23;
          }
        }
        bVar106 = (int)local_330 != 0;
        fVar108 = fVar107 + 1.0;
        for (; fVar130 = p->y0, fVar130 <= fVar108; p = p + 1) {
          fVar122 = p->y1;
          if ((fVar130 != fVar122) || (NAN(fVar130) || NAN(fVar122))) {
            if (psVar99 == (stbtt__active_edge *)0x0) {
              if (iVar81 == 0) {
                puVar71 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar71 == (undefined8 *)0x0) {
                  iVar81 = 0;
                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                              ,0xad1,"stbtt__new_active","ImGui ASSERT FAILED: %s","z != __null");
                  psVar99 = (stbtt__active_edge *)0x0;
                  goto LAB_001a7cf0;
                }
                *puVar71 = local_3c0;
                fVar130 = p->y0;
                fVar122 = p->y1;
                iVar81 = 799;
                local_3c0 = puVar71;
              }
              else {
                iVar81 = iVar81 + -1;
              }
              psVar99 = (stbtt__active_edge *)(local_3c0 + (long)iVar81 * 4 + 1);
              psVar87 = (stbtt__active_edge *)0x0;
            }
            else {
              psVar87 = psVar99->next;
            }
            fVar125 = p->x0;
            fVar124 = (p->x1 - fVar125) / (fVar122 - fVar130);
            psVar99->fdx = fVar124;
            psVar99->fdy = (float)(-(uint)(fVar124 != 0.0) & (uint)(1.0 / fVar124));
            psVar99->fx = ((fVar107 - fVar130) * fVar124 + fVar125) - (float)iVar56;
            psVar99->direction = *(float *)(&DAT_00245330 + (ulong)(p->invert == 0) * 4);
            psVar99->sy = fVar130;
            psVar99->ey = fVar122;
            psVar99->next = (stbtt__active_edge *)0x0;
            if (fVar122 < fVar107 && (iVar76 == 0 && bVar106)) {
              psVar99->ey = fVar107;
              fVar122 = fVar107;
            }
            if (fVar122 < fVar107) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                          ,0xc76,"stbtt__rasterize_sorted_edges","ImGui ASSERT FAILED: %s",
                          "z->ey >= scan_y_top");
            }
            psVar99->next = _charstrings;
            _charstrings = psVar99;
            psVar99 = psVar87;
          }
LAB_001a7cf0:
        }
        local_2c8 = p;
        psVar87 = _charstrings;
        if (_charstrings != (stbtt__active_edge *)0x0) {
          for (; psVar87 != (stbtt__active_edge *)0x0; psVar87 = psVar87->next) {
            if (psVar87->ey < fVar107) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                          ,0xba5,"stbtt__fill_active_edges_new","ImGui ASSERT FAILED: %s",
                          "e->ey >= y_top");
            }
            fVar130 = psVar87->fx;
            fVar122 = psVar87->fdx;
            _x0_2 = ZEXT416((uint)fVar130);
            if ((fVar122 != 0.0) || (NAN(fVar122))) {
              fVar130 = psVar87->fdy;
              fVar125 = psVar87->sy;
              local_4ac = fVar122;
              if (fVar108 < fVar125) {
LAB_001a7e57:
                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                            ,3000,"stbtt__fill_active_edges_new","ImGui ASSERT FAILED: %s",
                            "e->sy <= y_bottom && e->ey >= y_top");
                fVar125 = psVar87->sy;
                local_4f8._0_4_ = psVar87->ey;
              }
              else {
                local_4f8._0_4_ = psVar87->ey;
                if (psVar87->ey < fVar107) goto LAB_001a7e57;
              }
              uVar128 = 0;
              uVar129 = 0;
              fVar122 = x0_2;
              fVar124 = local_4ac + fVar122;
              local_498._0_16_ = ZEXT416((uint)fVar124);
              auVar121._0_4_ = ~-(uint)(fVar107 < fVar125) & (uint)fVar122;
              auVar121._4_4_ = x0_2._4_4_;
              auVar121._8_4_ = x0_2._8_4_;
              auVar121._12_4_ = x0_2._12_4_;
              auVar121 = auVar121 |
                         ZEXT416((uint)((fVar125 - fVar107) * local_4ac + fVar122) &
                                 -(uint)(fVar107 < fVar125));
              fVar117 = auVar121._0_4_;
              if (0.0 <= fVar117) {
                local_398 = (float)(~-(uint)((float)local_4f8._0_4_ < fVar108) & (uint)fVar124 |
                                   (uint)(((float)local_4f8._0_4_ - fVar107) * local_4ac + fVar122)
                                   & -(uint)((float)local_4f8._0_4_ < fVar108));
                if (((0.0 <= local_398) && (fVar117 < local_44c)) && (local_398 < local_44c)) {
                  if (fVar125 <= fVar107) {
                    fVar125 = fVar107;
                  }
                  uStack_4d4 = auVar121._4_4_;
                  uStack_4cc = auVar121._12_4_;
                  iVar102 = (int)fVar117;
                  fVar2 = (float)local_4f8._0_4_;
                  if (fVar108 <= (float)local_4f8._0_4_) {
                    fVar2 = fVar108;
                  }
                  local_4f8._0_4_ = fVar2;
                  iVar60 = (int)local_398;
                  if (iVar102 == iVar60) {
                    local_498._0_16_ = ZEXT416((uint)fVar125);
                    if ((iVar102 < 0) || (iVar58 < iVar102)) {
                      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                  ,0xbd4,"stbtt__fill_active_edges_new","ImGui ASSERT FAILED: %s",
                                  "x >= 0 && x < len");
                    }
                    lVar72 = (long)iVar102;
                    *(float *)((long)&scanline_00->data + lVar72 * 4) =
                         (((local_398 - (float)iVar102) + (fVar117 - (float)iVar102)) * -0.5 + 1.0)
                         * psVar87->direction * (fVar2 - (float)local_498._0_4_) +
                         *(float *)((long)&scanline_00->data + lVar72 * 4);
                    scanline[lVar72 + 1] =
                         (fVar2 - (float)local_498._0_4_) * psVar87->direction +
                         scanline[lVar72 + 1];
                  }
                  else {
                    fVar132 = fVar117;
                    iVar93 = iVar102;
                    if (local_398 < fVar117) {
                      fVar122 = fVar107 - fVar125;
                      uStack_4d4 = 0;
                      uStack_4cc = 0;
                      fVar125 = (fVar107 - fVar2) + fVar108;
                      fVar130 = -fVar130;
                      local_4f8._0_4_ = fVar122 + fVar108;
                      fVar132 = local_398;
                      iVar93 = iVar60;
                      iVar60 = iVar102;
                      fVar122 = fVar124;
                      local_398 = fVar117;
                    }
                    iVar102 = iVar93 + 1;
                    local_4ac = ((float)iVar102 - fVar122) * fVar130 + fVar107;
                    fVar122 = psVar87->direction;
                    local_498._0_16_ = ZEXT416((uint)fVar125);
                    auVar127._4_4_ = uStack_4d4;
                    auVar127._0_4_ = local_4ac - fVar125;
                    auVar127._8_4_ = 0;
                    auVar127._12_4_ = uStack_4cc;
                    register0x000012c4 = auVar127._4_12_;
                    x0_2 = (local_4ac - fVar125) * fVar122;
                    *(float *)((long)&scanline_00->data + (long)iVar93 * 4) =
                         (1.0 - ((fVar132 - (float)iVar93) + 1.0) * 0.5) * x0_2 +
                         *(float *)((long)&scanline_00->data + (long)iVar93 * 4);
                    lVar72 = (long)iVar102;
                    lVar95 = (long)iVar60;
                    while( true ) {
                      fVar125 = x0_2;
                      if (lVar95 <= lVar72) break;
                      *(float *)((long)&scanline_00->data + lVar72 * 4) =
                           fVar130 * fVar122 * 0.5 + fVar125 +
                           *(float *)((long)&scanline_00->data + lVar72 * 4);
                      x0_2 = fVar125 + fVar130 * fVar122;
                      lVar72 = lVar72 + 1;
                    }
                    if (1.01 < ABS(fVar125)) {
                      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                  ,0xbfb,"stbtt__fill_active_edges_new","ImGui ASSERT FAILED: %s",
                                  "fabsf(area) <= 1.01f");
                    }
                    *(float *)((long)&scanline_00->data + lVar95 * 4) =
                         ((float)local_4f8._0_4_ - (fVar130 * (float)(iVar60 - iVar102) + local_4ac)
                         ) * (((local_398 - (float)iVar60) + 0.0) * -0.5 + 1.0) * fVar122 + x0_2 +
                         *(float *)((long)&scanline_00->data + lVar95 * 4);
                    scanline[lVar95 + 1] =
                         ((float)local_4f8._0_4_ - (float)local_498._0_4_) * fVar122 +
                         scanline[lVar95 + 1];
                  }
                  goto LAB_001a7e19;
                }
              }
              uVar86 = 0;
              while (local_47c != uVar86) {
                local_4f8._0_4_ = (undefined4)(int)uVar86;
                fVar125 = (float)(int)(uVar86 + 1);
                fVar130 = ((float)local_4f8._0_4_ - x0_2) / local_4ac + fVar107;
                fVar122 = (fVar125 - x0_2) / local_4ac + fVar107;
                local_4f8._4_4_ = uVar128;
                local_4f8._8_4_ = 0;
                uStack_4ec = uVar129;
                if (((float)local_4f8._0_4_ <= x0_2) || ((float)local_498._0_4_ <= fVar125)) {
                  if (((float)local_4f8._0_4_ <= (float)local_498._0_4_) || (x0_2 <= fVar125)) {
                    fVar124 = x0_2;
                    fVar117 = fVar107;
                    if (((float)local_498._0_4_ <= (float)local_4f8._0_4_ ||
                         (float)local_4f8._0_4_ <= x0_2) &&
                       (x0_2 <= (float)local_4f8._0_4_ ||
                        (float)local_4f8._0_4_ <= (float)local_498._0_4_)) {
                      fVar130 = fVar107;
                      if ((fVar125 < (float)local_498._0_4_ && x0_2 < fVar125) ||
                         (fVar125 < x0_2 && (float)local_498._0_4_ < fVar125)) goto LAB_001a80eb;
                      goto LAB_001a8266;
                    }
                  }
                  else {
                    stbtt__handle_clipped_edge
                              ((float *)scanline_00,uVar86,psVar87,x0_2,fVar107,fVar125,fVar122);
                    fVar124 = fVar125;
                    fVar117 = fVar122;
                  }
                  stbtt__handle_clipped_edge
                            ((float *)scanline_00,uVar86,psVar87,fVar124,fVar117,
                             (float)local_4f8._0_4_,fVar130);
                  fVar124 = (float)local_4f8._0_4_;
                }
                else {
                  stbtt__handle_clipped_edge
                            ((float *)scanline_00,uVar86,psVar87,x0_2,fVar107,(float)local_4f8._0_4_
                             ,fVar130);
                  fVar124 = (float)local_4f8._0_4_;
LAB_001a80eb:
                  stbtt__handle_clipped_edge
                            ((float *)scanline_00,uVar86,psVar87,fVar124,fVar130,fVar125,fVar122);
                  fVar124 = fVar125;
                  fVar130 = fVar122;
                }
LAB_001a8266:
                uVar128 = 0;
                uVar129 = 0;
                stbtt__handle_clipped_edge
                          ((float *)scanline_00,uVar86,psVar87,fVar124,fVar130,local_498._0_4_,
                           fVar108);
                uVar86 = uVar86 + 1;
              }
            }
            else if (fVar130 < local_44c) {
              iVar102 = 0;
              if (0.0 <= fVar130) {
                stbtt__handle_clipped_edge
                          ((float *)scanline_00,(int)fVar130,psVar87,fVar130,fVar107,fVar130,fVar108
                          );
                iVar102 = (int)fVar130 + 1;
                fVar130 = x0_2;
              }
              stbtt__handle_clipped_edge(scanline,iVar102,psVar87,fVar130,fVar107,fVar130,fVar108);
            }
LAB_001a7e19:
          }
        }
        fVar107 = 0.0;
        lVar72 = local_2f0;
        psVar79 = scanline_00;
        iVar102 = iVar59;
        while (bVar106 = lVar72 != 0, lVar72 = lVar72 + -1, bVar106) {
          fVar107 = fVar107 + *(float *)((long)&psVar79->data + local_2e8 * 4);
          iVar60 = (int)(ABS(*(float *)&psVar79->data + fVar107) * 255.0 + 0.5);
          if (0xfe < iVar60) {
            iVar60 = 0xff;
          }
          puVar105[iVar102] = (uchar)iVar60;
          iVar102 = iVar102 + 1;
          psVar79 = (stbtt__buf *)((long)&psVar79->data + 4);
        }
        psVar73 = &charstrings;
        while (psVar73 = *(stbtt_uint32 **)psVar73, psVar73 != (stbtt_uint32 *)0x0) {
          psVar73[2] = (stbtt_uint32)((float)psVar73[3] + (float)psVar73[2]);
        }
        uVar103 = (ulong)((int)uVar103 + 1);
        iVar59 = iVar59 + iVar55;
        p = local_2c8;
      }
      while (points = local_338, local_3c0 != (undefined8 *)0x0) {
        puVar71 = (undefined8 *)*local_3c0;
        ImGui::MemFree(local_3c0);
        local_3c0 = puVar71;
      }
      if (scanline_00 != &b) {
        ImGui::MemFree(scanline_00);
      }
      ImGui::MemFree(psVar70);
    }
    ImGui::MemFree(ptr_00);
    ImGui::MemFree(points);
  }
LAB_001a85b6:
  ImGui::MemFree((void *)CONCAT44(uStack_454,fdarrayoff));
  uVar77._0_2_ = psVar66[lVar94].x;
  uVar77._2_2_ = psVar66[lVar94].y;
  uVar86._0_2_ = psVar66[lVar94].w;
  uVar86._2_2_ = psVar66[lVar94].h;
  if (1 < (byte)local_310) {
    lVar72 = (long)(int)((uVar77 >> 0x10) * iVar55);
    puVar105 = puVar69 + lVar72 + (ulong)(ushort)(undefined2)uVar77;
    iVar56 = (uVar86 & 0xffff) - (uint)local_4a8;
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    if (iVar56 < 0) {
      iVar56 = -1;
    }
    uVar103 = (long)iVar56 + 1;
    puVar100 = local_2f8 + lVar72 + (ulong)(ushort)(undefined2)uVar77 + (long)iVar56;
    for (uVar77 = 0; uVar91 = local_310, uVar77 != uVar86 >> 0x10; uVar77 = uVar77 + 1) {
      memset(&b,0,local_310);
      switch((int)uVar91) {
      case 2:
        uVar82 = 0;
        for (uVar91 = 0; uVar103 != uVar91; uVar91 = uVar91 + 1) {
          bVar14 = puVar105[uVar91];
          bVar15 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 2 & 7)) = bVar14;
          uVar82 = uVar82 + ((uint)bVar14 - (uint)bVar15);
          puVar105[uVar91] = (uchar)(uVar82 >> 1);
        }
        break;
      case 3:
        uVar82 = 0;
        for (uVar91 = 0; uVar103 != uVar91; uVar91 = uVar91 + 1) {
          bVar14 = puVar105[uVar91];
          bVar15 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 3 & 7)) = bVar14;
          uVar82 = uVar82 + ((uint)bVar14 - (uint)bVar15);
          puVar105[uVar91] = (uchar)((ulong)uVar82 / 3);
        }
        break;
      case 4:
        uVar82 = 0;
        for (uVar91 = 0; uVar103 != uVar91; uVar91 = uVar91 + 1) {
          bVar14 = puVar105[uVar91];
          uVar78 = (ulong)((uint)uVar91 & 7);
          bVar15 = *(byte *)((long)&b.data + uVar78);
          *(byte *)((long)&b.data + (uVar78 ^ 4)) = bVar14;
          uVar82 = uVar82 + ((uint)bVar14 - (uint)bVar15);
          puVar105[uVar91] = (uchar)(uVar82 >> 2);
        }
        break;
      case 5:
        uVar82 = 0;
        for (uVar91 = 0; uVar103 != uVar91; uVar91 = uVar91 + 1) {
          bVar14 = puVar105[uVar91];
          bVar15 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 5 & 7)) = bVar14;
          uVar82 = uVar82 + ((uint)bVar14 - (uint)bVar15);
          puVar105[uVar91] = (uchar)((ulong)uVar82 / 5);
        }
        break;
      default:
        uVar82 = 0;
        for (uVar91 = 0; uVar103 != uVar91; uVar91 = uVar91 + 1) {
          bVar14 = puVar105[uVar91];
          bVar15 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((int)local_4a8 + (uint)uVar91 & 7)) = bVar14;
          uVar82 = uVar82 + ((uint)bVar14 - (uint)bVar15);
          puVar105[uVar91] = (uchar)((ulong)uVar82 / ((ulong)local_4a8 & 0xffffffff));
        }
      }
      local_4f8._0_8_ = puVar100;
      puVar96 = puVar100;
      for (uVar91 = uVar103; uVar91 < (uVar86 & 0xffff); uVar91 = uVar91 + 1) {
        if (*puVar96 != '\0') {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                      ,0xf41,"stbtt__h_prefilter","ImGui ASSERT FAILED: %s","pixels[i] == 0");
        }
        uVar82 = uVar82 - *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
        *puVar96 = (uchar)(uVar82 / (uint)local_4a8);
        puVar96 = puVar96 + 1;
      }
      puVar105 = puVar105 + lVar64;
      puVar100 = puVar100 + lVar64;
    }
    uVar77._0_2_ = psVar66[lVar94].x;
    uVar77._2_2_ = psVar66[lVar94].y;
    uVar86._0_2_ = psVar66[lVar94].w;
    uVar86._2_2_ = psVar66[lVar94].h;
  }
  if (1 < (byte)local_318) {
    lVar72 = (long)(int)((uVar77 >> 0x10) * iVar55);
    local_4f8._0_8_ = puVar69 + lVar72 + (ulong)(ushort)uVar77;
    uVar74 = (ushort)(uVar86 >> 0x10);
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    iVar56 = uVar74 - uVar98;
    if (iVar56 < 0) {
      iVar56 = -1;
    }
    uVar103 = (long)iVar56 + 1;
    puVar105 = puVar69 + lVar64 * uVar103 + lVar72 + (ulong)(ushort)uVar77;
    for (uVar77 = 0; uVar91 = local_318, uVar77 != (uVar86 & 0xffff); uVar77 = uVar77 + 1) {
      memset(&b,0,local_318);
      puVar100 = puVar105;
      uVar78 = uVar103;
      switch((int)uVar91) {
      case 2:
        uVar82 = 0;
        pbVar90 = (byte *)local_4f8._0_8_;
        for (uVar91 = 0; uVar103 != uVar91; uVar91 = uVar91 + 1) {
          bVar14 = *pbVar90;
          bVar15 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 2 & 7)) = bVar14;
          uVar82 = uVar82 + ((uint)bVar14 - (uint)bVar15);
          *pbVar90 = (byte)(uVar82 >> 1);
          pbVar90 = pbVar90 + lVar64;
        }
        break;
      case 3:
        uVar82 = 0;
        pbVar90 = (byte *)local_4f8._0_8_;
        for (uVar91 = 0; uVar103 != uVar91; uVar91 = uVar91 + 1) {
          bVar14 = *pbVar90;
          bVar15 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 3 & 7)) = bVar14;
          uVar82 = uVar82 + ((uint)bVar14 - (uint)bVar15);
          *pbVar90 = (byte)((ulong)uVar82 / 3);
          pbVar90 = pbVar90 + lVar64;
        }
        break;
      case 4:
        uVar82 = 0;
        pbVar90 = (byte *)local_4f8._0_8_;
        for (uVar91 = 0; uVar103 != uVar91; uVar91 = uVar91 + 1) {
          bVar14 = *pbVar90;
          uVar89 = (ulong)((uint)uVar91 & 7);
          bVar15 = *(byte *)((long)&b.data + uVar89);
          *(byte *)((long)&b.data + (uVar89 ^ 4)) = bVar14;
          uVar82 = uVar82 + ((uint)bVar14 - (uint)bVar15);
          *pbVar90 = (byte)(uVar82 >> 2);
          pbVar90 = pbVar90 + lVar64;
        }
        break;
      case 5:
        uVar82 = 0;
        pbVar90 = (byte *)local_4f8._0_8_;
        for (uVar91 = 0; uVar103 != uVar91; uVar91 = uVar91 + 1) {
          bVar14 = *pbVar90;
          bVar15 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar91 + 5 & 7)) = bVar14;
          uVar82 = uVar82 + ((uint)bVar14 - (uint)bVar15);
          *pbVar90 = (byte)((ulong)uVar82 / 5);
          pbVar90 = pbVar90 + lVar64;
        }
        break;
      default:
        uVar82 = 0;
        pbVar90 = (byte *)local_4f8._0_8_;
        for (uVar91 = 0; uVar103 != uVar91; uVar91 = uVar91 + 1) {
          bVar14 = *pbVar90;
          bVar15 = *(byte *)((long)&b.data + (ulong)((uint)uVar91 & 7));
          *(byte *)((long)&b.data + (ulong)(uVar98 + (uint)uVar91 & 7)) = bVar14;
          uVar82 = uVar82 + ((uint)bVar14 - (uint)bVar15);
          *pbVar90 = (byte)(uVar82 / uVar75);
          pbVar90 = pbVar90 + lVar64;
        }
      }
      for (; uVar78 < uVar74; uVar78 = uVar78 + 1) {
        if (*puVar100 != '\0') {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                      ,0xf7f,"stbtt__v_prefilter","ImGui ASSERT FAILED: %s",
                      "pixels[i*stride_in_bytes] == 0");
        }
        uVar82 = uVar82 - *(byte *)((long)&b.data + (ulong)((uint)uVar78 & 7));
        *puVar100 = (uchar)(uVar82 / uVar98);
        puVar100 = puVar100 + lVar64;
      }
      local_4f8._0_8_ = (byte *)(local_4f8._0_8_ + 1);
      puVar105 = puVar105 + 1;
    }
    uVar77._0_2_ = psVar66[lVar94].x;
    uVar77._2_2_ = psVar66[lVar94].y;
    uVar86._0_2_ = psVar66[lVar94].w;
    uVar86._2_2_ = psVar66[lVar94].h;
  }
  local_328->x0 = (short)uVar77;
  local_328->y0 = (short)(uVar77 >> 0x10);
  sVar113 = (short)(uVar86 >> 0x10);
  local_328->x1 = (short)uVar77 + (short)uVar86;
  local_328->y1 = (short)(uVar77 >> 0x10) + sVar113;
  local_328->xadvance = (float)(int)CONCAT11(uVar12,uVar13) * fVar101;
  local_68 = auVar126._0_4_;
  fStack_64 = auVar126._4_4_;
  local_58 = SUB164(~auVar133 & auVar120,0);
  fStack_54 = SUB164(~auVar133 & auVar120,4);
  local_328->xoff = (float)x0_1 * local_68 + local_58;
  local_328->yoff = (float)y0_1 * fStack_64 + fStack_54;
  auVar111._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
  auVar111._4_2_ = sVar113;
  auVar111._0_4_ = uVar86;
  local_328->xoff2 = (float)(int)((uVar86 & 0xffff) + x0_1) * local_68 + local_58;
  local_328->yoff2 = (float)(auVar111._4_4_ + y0_1) * fStack_64 + fStack_54;
  lVar94 = local_320;
  psVar97 = local_4b8;
LAB_001a8bd0:
  lVar94 = lVar94 + 1;
  lVar92 = lVar92 + 1;
  goto LAB_001a7300;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];

            const float char_advance_x_org = pc.xadvance;
            const float char_advance_x_mod = ImClamp(char_advance_x_org, cfg.GlyphMinAdvanceX, cfg.GlyphMaxAdvanceX);
            float char_off_x = font_off_x;
            if (char_advance_x_org != char_advance_x_mod)
                char_off_x += cfg.PixelSnapH ? ImFloor((char_advance_x_mod - char_advance_x_org) * 0.5f) : (char_advance_x_mod - char_advance_x_org) * 0.5f;

            // Register glyph
            stbtt_aligned_quad q;
            float dummy_x = 0.0f, dummy_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &dummy_x, &dummy_y, &q, 0);
            dst_font->AddGlyph((ImWchar)codepoint, q.x0 + char_off_x, q.y0 + font_off_y, q.x1 + char_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, char_advance_x_mod);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}